

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::on_name_lookup
          (torrent *this,error_code *e,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *addrs,
          int port,iterator web)

{
  uint uVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  time_point32 tVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  endpoint *ep;
  const_iterator __begin2;
  pointer a;
  pointer paVar9;
  undefined1 local_a8 [52];
  error_code_enum local_74 [7];
  data_union local_58;
  
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"completed resolve: %s",web._M_node[1]._M_next);
  *(undefined1 *)((long)&web._M_node[0xb]._M_next + 1) = 0;
  if (*(char *)((long)&web._M_node[0xb]._M_next + 2) == '\x01') {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"removed web seed");
    remove_web_seed_iter(this,web);
  }
  else if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    local_a8._32_8_ = web._M_node + 1;
    if (e->failed_ == false) {
      a = (addrs->
          super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>).
          _M_impl.super__Vector_impl_data._M_start;
      paVar9 = (addrs->
               super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (a != paVar9) {
        local_a8._40_8_ = paVar9;
        for (; a != paVar9; a = a + 1) {
          if ((*(char *)((long)&web._M_node[0xb]._M_next + 5) != '\x01') ||
             (bVar5 = is_global(a), bVar5)) {
            local_a8._0_2_ = (unsigned_short)port;
            ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
            ::emplace_back<boost::asio::ip::address_const&,unsigned_short>
                      ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                        *)(web._M_node + 7),a,(unsigned_short *)local_a8);
            iVar6 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
            if ((char)iVar6 != '\0') {
              boost::asio::ip::detail::endpoint::endpoint
                        ((endpoint *)local_74,a,(unsigned_short)port);
              print_endpoint_abi_cxx11_((string *)local_a8,(aux *)local_74,ep);
              (*(this->super_request_callback)._vptr_request_callback[7])
                        (this,"  -> %s",CONCAT62(local_a8._2_6_,local_a8._0_2_));
              ::std::__cxx11::string::~string((string *)local_a8);
              paVar9 = (pointer)local_a8._40_8_;
            }
          }
        }
        if (web._M_node[7]._M_next == web._M_node[7]._M_prev) {
          iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          uVar4 = local_a8._32_8_;
          if ((*(uint *)(CONCAT44(extraout_var_03,iVar6) + 0x68) & 3) != 0) {
            iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[5])();
            get_handle((torrent *)local_a8);
            local_74[0] = banned_by_ip_filter;
            alert_manager::
            emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,libtorrent::errors::error_code_enum>
                      ((alert_manager *)CONCAT44(extraout_var_04,iVar6),(torrent_handle *)local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar4,
                       local_74);
            ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
          }
          *(undefined1 *)((long)&web._M_node[0xb]._M_next + 6) = 1;
          return;
        }
        iVar6 = num_peers(this);
        if ((int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21
                        ) & 0xffffff) <= iVar6) {
          return;
        }
        iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x1e])();
        iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x2e])();
        iVar8 = session_settings::get_int
                          ((session_settings *)CONCAT44(extraout_var_02,iVar8),0x4055);
        if (iVar8 <= iVar6) {
          return;
        }
        p_Var3 = web._M_node[7]._M_next;
        local_58._0_8_ = p_Var3->_M_next;
        local_58._20_8_ = *(undefined8 *)((long)&p_Var3[1]._M_next + 4);
        local_58._16_4_ = (undefined4)((ulong)*(undefined8 *)((long)&p_Var3->_M_prev + 4) >> 0x20);
        local_58._8_4_ = SUB84(p_Var3->_M_prev,0);
        local_58._12_4_ = (undefined4)((ulong)p_Var3->_M_prev >> 0x20);
        connect_web_seed(this,web,(endpoint *)&local_58.base);
        return;
      }
    }
    iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    uVar4 = local_a8._32_8_;
    if ((*(uint *)(CONCAT44(extraout_var,iVar6) + 0x68) & 3) != 0) {
      iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_a8);
      alert_manager::
      emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,boost::system::error_code_const&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar6),(torrent_handle *)local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar4,e);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
    }
    iVar6 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar6 != '\0') {
      pcVar2 = ((_Alloc_hider *)uVar4)->_M_p;
      uVar1 = e->val_;
      (*e->cat_->_vptr_error_category[4])(local_a8,e->cat_,(ulong)uVar1);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** HOSTNAME LOOKUP FAILED: %s: (%d) %s",pcVar2,(ulong)uVar1,
                 CONCAT62(local_a8._2_6_,local_a8._0_2_));
      ::std::__cxx11::string::~string((string *)local_a8);
    }
    tVar7 = time_now32();
    iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    iVar6 = session_settings::get_int((session_settings *)CONCAT44(extraout_var_01,iVar6),0x4080);
    *(int *)((long)&web._M_node[6]._M_prev + 4) = iVar6 + (int)tVar7.__d.__r;
  }
  return;
}

Assistant:

void torrent::on_name_lookup(error_code const& e
		, std::vector<address> const& addrs
		, int const port
		, std::list<web_seed_t>::iterator web) try
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		TORRENT_ASSERT(web->resolving);
#ifndef TORRENT_DISABLE_LOGGING
		debug_log("completed resolve: %s", web->url.c_str());
#endif
		web->resolving = false;
		if (web->removed)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("removed web seed");
#endif
			remove_web_seed_iter(web);
			return;
		}

		if (m_abort) return;

		if (e || addrs.empty())
		{
			if (m_ses.alerts().should_post<url_seed_alert>())
				m_ses.alerts().emplace_alert<url_seed_alert>(get_handle(), web->url, e);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("*** HOSTNAME LOOKUP FAILED: %s: (%d) %s"
					, web->url.c_str(), e.value(), e.message().c_str());
			}
#endif

			// unavailable, retry in `settings_pack::web_seed_name_lookup_retry` seconds
			web->retry = aux::time_now32()
				+ seconds32(settings().get_int(settings_pack::web_seed_name_lookup_retry));
			return;
		}

		for (auto const& addr : addrs)
		{
			// if this is set, we don't allow this web seed to have resolved to a
			// local IP
			if (web->no_local_ips && !aux::is_global(addr)) continue;

			// fill in the peer struct's address field
			web->endpoints.emplace_back(addr, std::uint16_t(port));

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
				debug_log("  -> %s", print_endpoint(tcp::endpoint(addr, std::uint16_t(port))).c_str());
#endif
		}

		if (web->endpoints.empty())
		{
			if (m_ses.alerts().should_post<url_seed_alert>())
			{
				m_ses.alerts().emplace_alert<url_seed_alert>(get_handle()
					, web->url, errors::banned_by_ip_filter);
			}

			// the name lookup failed for the http host. Don't try
			// this host again
			web->disabled = true;
			return;
		}

		if (num_peers() >= int(m_max_connections)
			|| m_ses.num_connections() >= settings().get_int(settings_pack::connections_limit))
			return;

		connect_web_seed(web, web->endpoints.front());
	}
	catch (...) { handle_exception(); }